

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::
     Serialization<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>::
     load(BinaryBuffer *bb,Vector *v)

{
  vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *in_RSI;
  BinaryBuffer *in_RDI;
  size_t s;
  Point<float,_3U> *in_stack_ffffffffffffffb8;
  Point<float,_3U> *in_stack_ffffffffffffffc0;
  value_type *in_stack_ffffffffffffffe0;
  size_type in_stack_ffffffffffffffe8;
  
  load<unsigned_long>((BinaryBuffer *)in_stack_ffffffffffffffc0,
                      (unsigned_long *)in_stack_ffffffffffffffb8);
  Point<float,_3U>::Point(in_stack_ffffffffffffffc0);
  std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::resize
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (in_stack_ffffffffffffffe8 != 0) {
    std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::operator[]
              (in_RSI,0);
    load<diy::Point<float,3u>>(in_RDI,in_stack_ffffffffffffffb8,0x182bd1);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }